

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseInfo::TestCaseInfo(TestCaseInfo *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->m_test).m_p = (ITestCase *)0x0;
  (this->m_className)._M_dataplus._M_p = (pointer)&(this->m_className).field_2;
  (this->m_className)._M_string_length = 0;
  (this->m_className).field_2._M_local_buf[0] = '\0';
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_lineInfo).file._M_dataplus._M_p = (pointer)&(this->m_lineInfo).file.field_2;
  (this->m_lineInfo).file._M_string_length = 0;
  (this->m_lineInfo).file.field_2._M_local_buf[0] = '\0';
  (this->m_lineInfo).line = 0;
  this->m_isHidden = false;
  return;
}

Assistant:

Ptr( T* p ) : m_p( p ){
            if( m_p )
                m_p->addRef();
        }